

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O3

void lj_sysprof_add_trace(GCtrace *tr)

{
  if ((sysprof.state == 1) && (sysprof.opt.mode != '\0')) {
    sysprof.state = 0;
    lj_wbuf_addbyte(&sysprof.out,'\f');
    lj_symtab_dump_trace(&sysprof.out,tr);
    sysprof.state = 1;
  }
  return;
}

Assistant:

void lj_sysprof_add_trace(const struct GCtrace *tr)
{
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_PROFILE || sp->opt.mode == LUAM_SYSPROF_DEFAULT)
    return;

  /* See the comment about the sysprof state above. */
  sp->state = SPS_IDLE;
  lj_wbuf_addbyte(&sp->out, LJP_SYMTAB_TRACE_EVENT);
  lj_symtab_dump_trace(&sp->out, tr);
  sp->state = SPS_PROFILE;
}